

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

int __thiscall
gl4cts::GLSL420Pack::Utils::texture::bind(texture *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  GLenum GVar2;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLenum target;
  Functions *gl;
  texture *this_local;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  GVar2 = getTextureTartet(this->m_texture_type);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xb8))(GVar2,this->m_id);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4814);
  return extraout_EAX;
}

Assistant:

void Utils::texture::bind() const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum target = getTextureTartet(m_texture_type);

	gl.bindTexture(target, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}